

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O1

void __thiscall OpenMD::ZConstraintForceModifier::doZconstraintForce(ZConstraintForceModifier *this)

{
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *plVar1;
  _List_node_base *p_Var2;
  Molecule *pMVar3;
  pointer ppSVar4;
  _List_node_base *p_Var5;
  pointer ppSVar6;
  uint i;
  _List_node_base *p_Var7;
  StuntDouble *pSVar8;
  long lVar9;
  uint i_1;
  _List_node_base *p_Var10;
  long lVar11;
  _List_node_base *p_Var12;
  pointer ppMVar13;
  _List_node_base *p_Var14;
  RealType RVar15;
  double local_70;
  double local_68 [4];
  double local_48;
  undefined8 uStack_40;
  
  plVar1 = &this->fixedZMols_;
  p_Var12 = (this->fixedZMols_).
            super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var12 == (_List_node_base *)plVar1) {
    local_70 = 0.0;
  }
  else {
    local_70 = 0.0;
    p_Var5 = p_Var12;
    do {
      p_Var14 = p_Var5[1]._M_next;
      p_Var5[3]._M_next = (_List_node_base *)0x0;
      p_Var7 = p_Var14[10]._M_next;
      if (p_Var7 == *(_List_node_base **)((long)(p_Var14 + 10) + 8)) {
        p_Var10 = (_List_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var7->_M_next;
      }
      if (p_Var10 != (_List_node_base *)0x0) {
        p_Var2 = *(_List_node_base **)((long)(p_Var14 + 10) + 8);
        p_Var14 = p_Var5[3]._M_next;
        do {
          p_Var7 = (_List_node_base *)&p_Var7->_M_prev;
          p_Var14 = (_List_node_base *)
                    ((double)p_Var14 +
                    *(double *)
                     (*(long *)((long)(*(_List_node_base **)
                                        ((long)(*(_List_node_base **)((long)(p_Var10 + 1) + 8) + 1)
                                        + 8) + 3) + (long)p_Var10[1]._M_next) + 0x10 +
                     (long)*(int *)&p_Var10[3]._M_next * 0x18));
          p_Var5[3]._M_next = p_Var14;
          if (p_Var7 == p_Var2) {
            p_Var10 = (_List_node_base *)0x0;
          }
          else {
            p_Var10 = p_Var7->_M_next;
          }
        } while (p_Var10 != (_List_node_base *)0x0);
      }
      local_70 = local_70 + (double)p_Var5[3]._M_next;
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)plVar1);
  }
  for (; p_Var12 != (_List_node_base *)plVar1; p_Var12 = p_Var12->_M_next) {
    pMVar3 = (Molecule *)p_Var12[1]._M_next;
    ppSVar6 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (ppSVar6 ==
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar8 = (StuntDouble *)0x0;
      }
      else {
        pSVar8 = *ppSVar6;
      }
      if (pSVar8 == (StuntDouble *)0x0) break;
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_48 = -pSVar8->mass_ * (double)p_Var12[3]._M_next;
      uStack_40 = 0x8000000000000000;
      RVar15 = Molecule::getMass(pMVar3);
      local_68[2] = local_48 / RVar15;
      lVar9 = (long)pSVar8->localIndex_ * 0x18 +
              *(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_);
      lVar11 = 0;
      do {
        *(double *)(lVar9 + lVar11 * 8) = local_68[lVar11] + *(double *)(lVar9 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      ppSVar6 = ppSVar6 + 1;
    }
  }
  for (p_Var12 = (this->movingZMols_).
                 super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
                 _M_impl._M_node.super__List_node_base._M_next;
      p_Var12 != (_List_node_base *)&this->movingZMols_; p_Var12 = p_Var12->_M_next) {
    pMVar3 = (Molecule *)p_Var12[1]._M_next;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    RVar15 = Molecule::getMass(pMVar3);
    local_68[2] = (-RVar15 * local_70) / (this->totMassUnconsMols_ + this->totMassMovingZMols_);
    ppSVar6 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar4 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (ppSVar6 == ppSVar4) {
        pSVar8 = (StuntDouble *)0x0;
      }
      else {
        pSVar8 = *ppSVar6;
      }
      if (pSVar8 == (StuntDouble *)0x0) break;
      lVar9 = (long)pSVar8->localIndex_ * 0x18 +
              *(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_);
      lVar11 = 0;
      do {
        *(double *)(lVar9 + lVar11 * 8) = local_68[lVar11] + *(double *)(lVar9 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      ppSVar6 = ppSVar6 + 1;
    }
  }
  for (ppMVar13 = (this->unzconsMols_).
                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppMVar13 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar13 = ppMVar13 + 1) {
    pMVar3 = *ppMVar13;
    local_68[0] = 0.0;
    local_68[1] = 0.0;
    local_68[2] = 0.0;
    RVar15 = Molecule::getMass(pMVar3);
    local_68[2] = (-RVar15 * local_70) / (this->totMassUnconsMols_ + this->totMassMovingZMols_);
    ppSVar6 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar4 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (ppSVar6 == ppSVar4) {
        pSVar8 = (StuntDouble *)0x0;
      }
      else {
        pSVar8 = *ppSVar6;
      }
      if (pSVar8 == (StuntDouble *)0x0) break;
      lVar9 = (long)pSVar8->localIndex_ * 0x18 +
              *(long *)((long)&(pSVar8->snapshotMan_->currentSnapshot_->atomData).force.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar8->storage_);
      lVar11 = 0;
      do {
        *(double *)(lVar9 + lVar11 * 8) = local_68[lVar11] + *(double *)(lVar9 + lVar11 * 8);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      ppSVar6 = ppSVar6 + 1;
    }
  }
  return;
}

Assistant:

void ZConstraintForceModifier::doZconstraintForce() {
    RealType totalFZ(0.0);

    // Calculate the total z-contraint force on the fixed molecules:

    std::list<ZconstraintMol>::iterator i;
    Molecule* mol;
    StuntDouble* sd;
    Molecule::IntegrableObjectIterator ii;

    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol   = i->mol;
      i->fz = 0.0;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        i->fz += (sd->getFrc())[whichDirection];
      }

      totalFZ += i->fz;
    }

#ifdef IS_MPI
    // collect the total z-constraint force
    MPI_Allreduce(MPI_IN_PLACE, &totalFZ, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // apply negative force to fixed z-constrained molecules:
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      mol = i->mol;

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        Vector3d force(0.0);
        force[whichDirection] = -getZFOfFixedZMols(mol, sd, i->fz);

        sd->addFrc(force);
      }
    }

    // modify the forces of the currently moving z-constrained
    // molecules so that system stays fixed:
    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      mol = i->mol;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }

    // modify the forces of unconstrained molecules so that the system
    // stays fixed:
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      mol = *j;

      Vector3d force(0.0);
      force[whichDirection] = -getZFOfMovingMols(mol, totalFZ);

      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->addFrc(force);
      }
    }
  }